

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

int INT_CMwrite_raw_notify
              (CMConnection conn,FFSEncodeVector full_vec,FFSEncodeVector data_vec,long vec_count,
              size_t byte_count,attr_list attrs,int data_vec_stack,
              CMcompletion_notify_func notify_func,void *notify_client_data)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long *plVar3;
  transport_entry_conflict p_Var4;
  ulong uVar5;
  FFSEncodeVector pFVar6;
  FILE *pFVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  __pid_t _Var11;
  int iVar12;
  ulong uVar13;
  CMbuffer p_Var14;
  pthread_t pVar15;
  FFSEncodeVector pFVar16;
  size_t *psVar17;
  char cVar18;
  long lVar19;
  size_t sVar20;
  ulong uVar21;
  long lVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  bool bVar26;
  FFSEncodeVector local_60;
  timespec ts;
  
  if (conn->closed != 0) {
    return 0;
  }
  if (conn->failed != 0) {
    return 0;
  }
  if (conn->write_pending != 0) {
    wait_for_pending_write(conn);
  }
  uVar24 = 0;
  lVar22 = 0;
  if (0 < vec_count) {
    lVar22 = vec_count;
  }
  psVar17 = &full_vec->iov_len;
  lVar19 = lVar22;
  while (bVar26 = lVar19 != 0, lVar19 = lVar19 + -1, bVar26) {
    uVar24 = uVar24 + *psVar17;
    psVar17 = psVar17 + 2;
  }
  cVar18 = '\0';
  if (uVar24 < 0x2800) {
    uVar21 = 4;
    cVar18 = '\0';
    for (lVar19 = 0; lVar19 != lVar22; lVar19 = lVar19 + 1) {
      for (; uVar21 < full_vec[lVar19].iov_len; uVar21 = uVar21 + 1) {
        cVar18 = cVar18 + *(char *)((long)full_vec[lVar19].iov_base + uVar21);
      }
      uVar21 = 0;
    }
  }
  *(char *)full_vec->iov_base = cVar18;
  p_Var4 = conn->trans;
  if ((conn->do_non_blocking_write != 1) || (p_Var4->NBwritev_func == (CMTransport_writev_func)0x0))
  {
    if (notify_func == (CMcompletion_notify_func)0x0 ||
        p_Var4->writev_complete_notify_func == (CMTransport_writev_complete_notify_func)0x0) {
      iVar12 = (*p_Var4->writev_func)
                         (&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs);
      if (iVar12 == 0) {
        iVar10 = CMtrace_val[7];
        if (conn->cm->CMTrace_file == (FILE *)0x0) {
          iVar10 = CMtrace_init(conn->cm,CMFreeVerbose);
        }
        if (iVar10 != 0) {
          if (CMtrace_PID != 0) {
            pFVar7 = (FILE *)conn->cm->CMTrace_file;
            _Var11 = getpid();
            pVar15 = pthread_self();
            fprintf(pFVar7,"P%lxT%lx - ",(long)_Var11,pVar15);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,(timespec *)&ts);
            fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
          }
          fprintf((FILE *)conn->cm->CMTrace_file,
                  "Calling write failed connection failed with dereference %p\n",conn);
        }
        fflush((FILE *)conn->cm->CMTrace_file);
        INT_CMConnection_failed(conn);
      }
      lVar22 = (long)iVar12;
      if (notify_func != (CMcompletion_notify_func)0x0) {
        (*notify_func)(notify_client_data);
      }
    }
    else {
      iVar12 = (*p_Var4->writev_complete_notify_func)
                         (&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs,
                          notify_func,notify_client_data);
      lVar22 = (long)iVar12;
    }
LAB_0011f2b1:
    return (uint)(lVar22 == vec_count);
  }
  uVar9 = (*p_Var4->NBwritev_func)
                    (&CMstatic_trans_svcs,conn->transport_data,full_vec,vec_count,attrs);
  if ((int)uVar9 < 0) {
    iVar12 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar12 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar12 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = (FILE *)conn->cm->CMTrace_file;
        _Var11 = getpid();
        pVar15 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",(long)_Var11,pVar15);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,
              "Calling write failed connection failed with dereference %p\n",conn);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    INT_CMConnection_failed(conn);
    p_Var14 = (conn->queued_data).buffer_to_free;
    if (p_Var14 != (CMbuffer)0x0) {
      cm_return_data_buf(conn->cm,p_Var14);
      (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    }
    conn->write_pending = 0;
    (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,0);
    cm_wake_any_pending_write(conn);
  }
  lVar22 = vec_count;
  if ((long)uVar24 <= (long)(int)uVar9) goto LAB_0011f2b1;
  uVar25 = 0;
  uVar21 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar21 = uVar25;
  }
  local_60 = data_vec;
  if (data_vec_stack != 0) {
    local_60 = (FFSEncodeVector)copy_vector_to_FFSBuffer(conn->io_out_buffer,data_vec);
  }
  uVar13 = 0;
  if (0 < (int)vec_count) {
    uVar13 = vec_count & 0xffffffff;
  }
  lVar22 = 0;
  for (; uVar13 * 0x10 != uVar25; uVar25 = uVar25 + 0x10) {
    lVar22 = lVar22 + *(long *)((long)&full_vec->iov_len + uVar25);
  }
  lVar19 = 0;
  uVar13 = 0;
  uVar25 = uVar21;
  while( true ) {
    uVar5 = *(ulong *)((long)&full_vec->iov_len + lVar19);
    if (uVar25 < uVar5 || uVar25 - uVar5 == 0) break;
    uVar13 = uVar13 + 1;
    lVar19 = lVar19 + 0x10;
    uVar25 = uVar25 - uVar5;
  }
  *(ulong *)((long)&full_vec->iov_len + lVar19) = uVar5 - uVar25;
  plVar3 = (long *)((long)&full_vec->iov_base + lVar19);
  *plVar3 = *plVar3 + uVar25;
  if (local_60 != (FFSEncodeVector)0x0) {
    puVar1 = (undefined8 *)((long)&full_vec->iov_base + lVar19);
    uVar8 = puVar1[1];
    puVar2 = (undefined8 *)
             ((long)&local_60->iov_base +
             lVar19 + ((ulong)(attrs == (attr_list)0x0) << 4 | 0xffffffffffffffe0));
    *puVar2 = *puVar1;
    puVar2[1] = uVar8;
  }
  (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
  if (uVar13 == 0) {
    if (0x20 < full_vec->iov_len) {
      __assert_fail("sizeof(conn->queued_data.rem_header) >= tmp_vec[0].iov_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0xbae,
                    "void queue_remaining_write(CMConnection, FFSEncodeVector, FFSEncodeVector, int, attr_list, size_t, int)"
                   );
    }
    memcpy(&conn->queued_data,full_vec->iov_base,full_vec->iov_len);
    sVar23 = full_vec->iov_len;
  }
  else {
    sVar23 = 0;
  }
  (conn->queued_data).rem_header_len = sVar23;
  if (attrs == (attr_list)0x0 || 1 < uVar13) {
    sVar20 = 0;
  }
  else {
    (conn->queued_data).rem_attr_base = (char *)full_vec[1].iov_base;
    sVar20 = full_vec[1].iov_len;
    uVar13 = (ulong)((int)uVar13 + 1);
  }
  (conn->queued_data).rem_attr_len = sVar20;
  pFVar16 = (FFSEncodeVector)0x0;
  iVar12 = (int)uVar13;
  uVar9 = ((attrs == (attr_list)0x0) - 2) + iVar12;
  if (uVar9 != 0xffffffff) {
    if (local_60 == (FFSEncodeVector)0x0) {
      sVar23 = lVar22 - (sVar23 + uVar21 + sVar20);
      p_Var14 = cm_get_data_buf(conn->cm,sVar23 + 0x20);
      pFVar6 = (FFSEncodeVector)p_Var14->buffer;
      pFVar16 = pFVar6 + 2;
      iVar12 = iVar12 + (uint)(iVar12 == 0);
      iVar10 = 2;
      if (2 < iVar12) {
        iVar10 = iVar12;
      }
      pFVar6->iov_len = sVar23;
      pFVar6->iov_base = pFVar16;
      pFVar6[1].iov_base = (void *)0x0;
      pFVar6[1].iov_len = 0;
      (conn->queued_data).buffer_to_free = p_Var14;
      (conn->queued_data).vector_data = pFVar6;
      if (attrs == (attr_list)0x0) {
        iVar10 = iVar12;
      }
      lVar22 = (long)iVar10;
      psVar17 = &full_vec[lVar22].iov_len;
      for (; lVar22 < (int)vec_count; lVar22 = lVar22 + 1) {
        memcpy(pFVar16,((FFSEncodeVec *)(psVar17 + -1))->iov_base,*psVar17);
        pFVar16 = (FFSEncodeVector)((long)&pFVar16->iov_base + *psVar17);
        psVar17 = psVar17 + 2;
      }
      goto LAB_0011f561;
    }
    (conn->queued_data).buffer_to_free = (CMbuffer)0x0;
    if ((int)uVar9 < 0) {
      uVar25 = 0;
    }
    else {
      iVar12 = CMtrace_val[3];
      if (conn->cm->CMTrace_file == (FILE *)0x0) {
        iVar12 = CMtrace_init(conn->cm,CMLowLevelVerbose);
      }
      if (iVar12 != 0) {
        if (CMtrace_PID != 0) {
          pFVar7 = (FILE *)conn->cm->CMTrace_file;
          _Var11 = getpid();
          pVar15 = pthread_self();
          fprintf(pFVar7,"P%lxT%lx - ",(long)_Var11,pVar15);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,(timespec *)&ts);
          fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
        }
        fprintf((FILE *)conn->cm->CMTrace_file,"Removing from pbio_vec at offset %d\n",(ulong)uVar9)
        ;
      }
      fflush((FILE *)conn->cm->CMTrace_file);
      uVar25 = (ulong)uVar9;
    }
    pFVar16 = (FFSEncodeVector)copy_all_to_FFSBuffer(conn->io_out_buffer,local_60 + uVar25);
  }
  (conn->queued_data).vector_data = pFVar16;
LAB_0011f561:
  (*conn->trans->set_write_notify)(conn->trans,&CMstatic_trans_svcs,conn->transport_data,1);
  conn->write_pending = 1;
  iVar12 = CMtrace_val[3];
  if (conn->cm->CMTrace_file == (FILE *)0x0) {
    iVar12 = CMtrace_init(conn->cm,CMLowLevelVerbose);
  }
  if (iVar12 != 0) {
    if (CMtrace_PID != 0) {
      pFVar7 = (FILE *)conn->cm->CMTrace_file;
      _Var11 = getpid();
      pVar15 = pthread_self();
      fprintf(pFVar7,"P%lxT%lx - ",(long)_Var11,pVar15);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)conn->cm->CMTrace_file,"Partial write, queued %zd bytes\n",uVar24 - uVar21);
  }
  fflush((FILE *)conn->cm->CMTrace_file);
  return 1;
}

Assistant:

int
 INT_CMwrite_raw_notify(CMConnection conn, FFSEncodeVector full_vec, FFSEncodeVector data_vec,
			long vec_count, size_t byte_count, attr_list attrs, int data_vec_stack,
			CMcompletion_notify_func notify_func, void *notify_client_data)
 {
     size_t actual = 0;
     unsigned char checksum = 0;
     int i, j, start;
     size_t count = 0;
     size_t length = 0;
     if (conn->closed || conn->failed) return 0;

     if (conn->write_pending) {
	 wait_for_pending_write(conn);
     }
     for (i=0; i < vec_count; i++) {
	 length += full_vec[i].iov_len;
     }
     start = 4;
     if (length < 10240) {
	 /* do checksum for small messages */
	 for (i=0; i < vec_count; i++) {
	     count += full_vec[i].iov_len - start;
	     for (j=start; j< full_vec[i].iov_len; j++) {
		 checksum += ((unsigned char*)full_vec[i].iov_base)[j];
	     }
	     start = 0;
	 }
     }
     ((int*)full_vec[0].iov_base)[0] = 
	 (((int*)full_vec[0].iov_base)[0] & 0xffffff00) | (unsigned char) checksum;
     if ((conn->do_non_blocking_write == 1) && (conn->trans->NBwritev_func)) {
	 ssize_t actual_bytes;
	 actual_bytes = 
	     conn->trans->NBwritev_func(&CMstatic_trans_svcs, 
					     conn->transport_data, 
					     full_vec, vec_count, attrs);
	 if (actual_bytes < 0) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	     if (conn->queued_data.buffer_to_free) {
		 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
		 conn->queued_data.buffer_to_free = NULL;
	     }
	     conn->write_pending = 0;
	     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
					   conn->transport_data, 0);
	     cm_wake_any_pending_write(conn);
	 }
	 if (actual_bytes < (ssize_t)length) {
	     /* copy remaining and send it later */
	     if (actual_bytes < 0 ) actual_bytes = 0;
	     if (data_vec_stack) {
		 data_vec = copy_vector_to_FFSBuffer(conn->io_out_buffer, data_vec);
	     }
	     queue_remaining_write(conn, full_vec, data_vec, vec_count, 
				   attrs, actual_bytes, attrs != NULL);
	     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, conn->transport_data, 1);
	     conn->write_pending = 1;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, 
			 "Partial write, queued %zd bytes\n",
			 length - actual_bytes);
	     return 1;
	 }
	 actual = vec_count;  /* set actual for success */
     } else if (conn->trans->writev_complete_notify_func && notify_func) {
	 actual = conn->trans->writev_complete_notify_func(&CMstatic_trans_svcs, 
							   conn->transport_data, 
							   full_vec, vec_count, 
							   attrs, notify_func, notify_client_data);
     } else {
	 actual = conn->trans->writev_func(&CMstatic_trans_svcs, 
					   conn->transport_data, 
					   full_vec, vec_count, attrs);
	 if (actual <= 0) {
	     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
	     INT_CMConnection_failed(conn);
	 }
	 if (notify_func) {
	     (notify_func)(notify_client_data);
	 }
     }
     return actual == vec_count ? 1 : 0;
 }